

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdm.cpp
# Opt level: O2

void __thiscall FDMEulerExplicit::step_march(FDMEulerExplicit *this)

{
  vector<double,_std::allocator<double>_> *__x;
  ostream *poVar1;
  int j;
  ulong uVar2;
  double dVar3;
  ofstream fdm_out;
  
  std::ofstream::ofstream(&fdm_out,"fdm.csv",_S_out);
  __x = &(this->super_FDMBase).new_result;
  dVar3 = (this->super_FDMBase).cur_t;
  while (dVar3 < (this->super_FDMBase).t_dom) {
    (this->super_FDMBase).cur_t = (this->super_FDMBase).prev_t + (this->super_FDMBase).dt;
    (*(this->super_FDMBase)._vptr_FDMBase[2])(this);
    (*(this->super_FDMBase)._vptr_FDMBase[3])(this);
    for (uVar2 = 0; uVar2 < (this->super_FDMBase).J; uVar2 = uVar2 + 1) {
      poVar1 = std::ostream::_M_insert<double>
                         ((this->super_FDMBase).x_values.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar2]);
      std::operator<<(poVar1," ");
      poVar1 = std::ostream::_M_insert<double>((this->super_FDMBase).prev_t);
      std::operator<<(poVar1," ");
      poVar1 = std::ostream::_M_insert<double>
                         ((__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar2]);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::vector<double,_std::allocator<double>_>::operator=(&(this->super_FDMBase).old_result,__x);
    dVar3 = (this->super_FDMBase).cur_t;
    (this->super_FDMBase).prev_t = dVar3;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&fdm_out);
  return;
}

Assistant:

void FDMEulerExplicit::step_march()
{
    std::ofstream fdm_out("fdm.csv");

    while(cur_t < t_dom)
    {
        cur_t = prev_t + dt;
        calculate_boundary_conditions();
        calculate_inner_domain();
        for (int j=0; j<J; j++)
        {
            fdm_out << x_values[j] << " " << prev_t << " " << new_result[j] << std::endl;
        }

        old_result = new_result;
        prev_t = cur_t;
    }
    fdm_out.close();
}